

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void removeStringImpl<QStringView>(QString *s,QStringView *needle,CaseSensitivity cs)

{
  bool bVar1;
  DataPointer *this;
  char *__file;
  iterator dst_00;
  QChar *__last;
  QString *this_00;
  __off_t __length;
  QStringView *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  iterator copy_begin;
  DataPointer *dptr;
  QChar *dst_1;
  QString copy;
  char16_t *dst;
  anon_class_56_7_a7ebae20 copyFunc;
  char16_t *end;
  char16_t *begin;
  qsizetype i;
  qsizetype needleSize;
  undefined4 in_stack_fffffffffffffef8;
  CaseSensitivity in_stack_fffffffffffffefc;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  char16_t *in_stack_ffffffffffffff10;
  char16_t *in_stack_ffffffffffffff18;
  QChar *__first;
  char16_t **in_stack_ffffffffffffff20;
  anon_class_56_7_a7ebae20 *in_stack_ffffffffffffff28;
  QStringView in_stack_ffffffffffffff30;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  char16_t *local_80;
  char16_t **local_78;
  qsizetype *local_70;
  qsizetype *local_68;
  char16_t **local_60;
  undefined1 *local_48;
  char16_t *local_40;
  char16_t *local_38;
  qsizetype local_30;
  storage_type_conflict *local_28;
  qsizetype local_20;
  qsizetype local_18;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = QStringView::size(in_RSI);
  if (local_18 != 0) {
    local_30 = in_RSI->m_size;
    local_28 = in_RSI->m_data;
    local_20 = QString::indexOf(in_stack_ffffffffffffff08,in_stack_ffffffffffffff30,
                                (qsizetype)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (-1 < local_20) {
      this = QString::data_ptr(in_RDI);
      local_38 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50b05d);
      local_40 = QArrayDataPointer<char16_t>::end(in_stack_ffffffffffffff00);
      memset(&local_78,0xaa,0x38);
      local_78 = &local_38;
      local_70 = &local_20;
      local_68 = &local_18;
      local_60 = &local_40;
      local_48 = local_c;
      QArrayDataPointer<char16_t>::operator->(this);
      bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_stack_ffffffffffffff00);
      if (bVar1) {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        QString::size(in_RDI);
        __first = (QChar *)&local_98;
        QString::QString((QString *)in_stack_ffffffffffffff28,(qsizetype)in_stack_ffffffffffffff20,
                         (Initialization)((ulong)__first >> 0x20));
        dst_00 = QString::begin((QString *)in_stack_ffffffffffffff00);
        __last = std::copy<char16_t*,QChar*>
                           (in_stack_ffffffffffffff10,(char16_t *)in_stack_ffffffffffffff08,
                            (QChar *)in_stack_ffffffffffffff00);
        removeStringImpl<QStringView>(QString&,QStringView_const&,Qt::CaseSensitivity)::
        {lambda(auto:1&)#1}::operator()(in_stack_ffffffffffffff28,(QChar **)dst_00);
        this_00 = (QString *)std::distance<QChar*>(__first,__last);
        QString::resize(this_00,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QString::swap(this_00,(QString *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QString::~QString((QString *)0x50b263);
      }
      else {
        local_80 = local_38 + local_20;
        local_80 = removeStringImpl<QStringView>(QString&,QStringView_const&,Qt::CaseSensitivity)::
                   {lambda(auto:1&)#1}::operator()
                             (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        __file = (char *)std::distance<char16_t*>
                                   (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        QString::truncate(in_RDI,__file,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void removeStringImpl(QString &s, const T &needle, Qt::CaseSensitivity cs)
{
    const auto needleSize = needle.size();
    if (!needleSize)
        return;

    // avoid detach if nothing to do:
    qsizetype i = s.indexOf(needle, 0, cs);
    if (i < 0)
        return;

    QString::DataPointer &dptr = s.data_ptr();
    auto begin = dptr.begin();
    auto end = dptr.end();

    auto copyFunc = [&](auto &dst) {
        auto src = begin + i + needleSize;
        while (src < end) {
            i = s.indexOf(needle, std::distance(begin, src), cs);
            auto hit = i == -1 ? end : begin + i;
            dst = std::copy(src, hit, dst);
            src = hit + needleSize;
        }
        return dst;
    };

    if (!dptr->needsDetach()) {
        auto dst = begin + i;
        dst = copyFunc(dst);
        s.truncate(std::distance(begin, dst));
    } else {
        QString copy{s.size(), Qt::Uninitialized};
        auto copy_begin = copy.begin();
        auto dst = std::copy(begin, begin + i, copy_begin); // Chunk before the first hit
        dst = copyFunc(dst);
        copy.resize(std::distance(copy_begin, dst));
        s.swap(copy);
    }
}